

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

int __thiscall lzham::lzcompressor::state::init(state *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  raw_quasi_adaptive_huffman_data_model *prVar8;
  
  (this->super_state_base).m_cur_ofs = 0;
  (this->super_state_base).m_cur_state = 0;
  iVar3 = raw_quasi_adaptive_huffman_data_model::init
                    (&this->m_rep_len_table[0].super_raw_quasi_adaptive_huffman_data_model,
                     (EVP_PKEY_CTX *)0x1);
  if ((char)iVar3 != '\0') {
    lVar7 = 0;
    bVar2 = false;
    bVar1 = false;
    do {
      iVar3 = raw_quasi_adaptive_huffman_data_model::init
                        (&this->m_large_len_table[lVar7].super_raw_quasi_adaptive_huffman_data_model
                         ,(EVP_PKEY_CTX *)0x1);
      if ((char)iVar3 == '\0') break;
      if (bVar2) goto LAB_0010b39b;
      iVar3 = raw_quasi_adaptive_huffman_data_model::init
                        (&this->m_rep_len_table[1].super_raw_quasi_adaptive_huffman_data_model,
                         (EVP_PKEY_CTX *)0x1);
      lVar7 = 1;
      bVar1 = bVar2;
      bVar2 = true;
    } while ((char)iVar3 != '\0');
    if (bVar1) {
LAB_0010b39b:
      iVar3 = raw_quasi_adaptive_huffman_data_model::init
                        (&(this->m_main_table).super_raw_quasi_adaptive_huffman_data_model,
                         (EVP_PKEY_CTX *)0x1);
      if ((((char)iVar3 != '\0') &&
          (iVar3 = raw_quasi_adaptive_huffman_data_model::init
                             (&(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model,
                              (EVP_PKEY_CTX *)0x1), (char)iVar3 != '\0')) &&
         (iVar3 = raw_quasi_adaptive_huffman_data_model::init
                            (&this->m_lit_table[0].super_raw_quasi_adaptive_huffman_data_model,
                             (EVP_PKEY_CTX *)0x1), (char)iVar3 != '\0')) {
        prVar8 = &this->m_lit_table[1].super_raw_quasi_adaptive_huffman_data_model;
        uVar5 = 0xffffffffffffffff;
        do {
          if (uVar5 == 0x3e) goto LAB_0010b453;
          iVar3 = raw_quasi_adaptive_huffman_data_model::init(prVar8,(EVP_PKEY_CTX *)0x1);
          uVar5 = uVar5 + 1;
          prVar8 = (raw_quasi_adaptive_huffman_data_model *)&prVar8[1].m_pDecode_tables;
        } while ((char)iVar3 != '\0');
        if (0x3e < uVar5) {
LAB_0010b453:
          uVar4 = raw_quasi_adaptive_huffman_data_model::init
                            (&this->m_delta_lit_table[0].super_raw_quasi_adaptive_huffman_data_model
                             ,(EVP_PKEY_CTX *)0x1);
          uVar5 = (ulong)uVar4;
          if ((char)uVar4 != '\0') {
            prVar8 = &this->m_delta_lit_table[1].super_raw_quasi_adaptive_huffman_data_model;
            uVar6 = 0xffffffffffffffff;
            do {
              if (uVar6 == 0x3e) goto LAB_0010b4b0;
              uVar4 = raw_quasi_adaptive_huffman_data_model::init(prVar8,(EVP_PKEY_CTX *)0x1);
              uVar5 = (ulong)uVar4;
              uVar6 = uVar6 + 1;
              prVar8 = (raw_quasi_adaptive_huffman_data_model *)&prVar8[1].m_pDecode_tables;
            } while ((char)uVar4 != '\0');
            if (0x3e < uVar6) {
LAB_0010b4b0:
              (this->super_state_base).m_match_hist[0] = 1;
              (this->super_state_base).m_match_hist[1] = 1;
              (this->super_state_base).m_match_hist[2] = 1;
              (this->super_state_base).m_match_hist[3] = 1;
              (this->super_state_base).m_cur_ofs = 0;
              return (int)CONCAT71((int7)(uVar5 >> 8),1);
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

bool lzcompressor::state::init(CLZBase& lzbase, bool fast_adaptive_huffman_updating, bool use_polar_codes)
   {
      m_cur_ofs = 0;
      m_cur_state = 0;

      for (uint i = 0; i < 2; i++)
      {
         if (!m_rep_len_table[i].init(true, CLZBase::cMaxMatchLen - CLZBase::cMinMatchLen + 1, fast_adaptive_huffman_updating, use_polar_codes)) return false;
         if (!m_large_len_table[i].init(true, CLZBase::cLZXNumSecondaryLengths, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }
      if (!m_main_table.init(true, CLZBase::cLZXNumSpecialLengths + (lzbase.m_num_lzx_slots - CLZBase::cLZXLowestUsableMatchSlot) * 8, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      if (!m_dist_lsb_table.init(true, 16, fast_adaptive_huffman_updating, use_polar_codes)) return false;

      for (uint i = 0; i < (1 << CLZBase::cNumLitPredBits); i++)
      {
         if (!m_lit_table[i].init(true, 256, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }

      for (uint i = 0; i < (1 << CLZBase::cNumDeltaLitPredBits); i++)
      {
         if (!m_delta_lit_table[i].init(true, 256, fast_adaptive_huffman_updating, use_polar_codes)) return false;
      }

      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;

      m_cur_ofs = 0;

      return true;
   }